

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensor.cpp
# Opt level: O0

void __thiscall LidarSensor::LidarSensor(LidarSensor *this,string *name,VectorXd *noise,int debug)

{
  string local_48 [36];
  int local_24;
  VectorXd *pVStack_20;
  int debug_local;
  VectorXd *noise_local;
  string *name_local;
  LidarSensor *this_local;
  
  local_24 = debug;
  pVStack_20 = noise;
  noise_local = (VectorXd *)name;
  name_local = (string *)this;
  std::__cxx11::string::string(local_48,(string *)name);
  Sensor::Sensor(&this->super_Sensor,(string *)local_48,pVStack_20,2,local_24);
  std::__cxx11::string::~string(local_48);
  (this->super_Sensor)._vptr_Sensor = (_func_int **)&PTR__LidarSensor_002d4c78;
  return;
}

Assistant:

LidarSensor::LidarSensor(string name, const VectorXd& noise, int debug) :
        Sensor(name, noise, 2, debug)
{}